

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VScaleVectorArray(int nvec,realtype *c,N_Vector *X,N_Vector *Z)

{
  _func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvscalevectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,X,Z);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      (*(*Z)->ops->nvscale)(c[uVar2],X[uVar2],Z[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VScaleVectorArray(int nvec, realtype* c, N_Vector* X, N_Vector* Z)
{
  int i;

  if (Z[0]->ops->nvscalevectorarray != NULL) {
    
    return(Z[0]->ops->nvscalevectorarray(nvec, c, X, Z));

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvscale(c[i], X[i], Z[i]);
    }
    return(0);

  }
}